

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

void __thiscall PSBTOutput::FillSignatureData(PSBTOutput *this,SignatureData *sigdata)

{
  long lVar1;
  pointer poVar2;
  pointer poVar3;
  undefined8 uVar4;
  Span<const_unsigned_char> script_00;
  bool bVar5;
  const_iterator this_00;
  const_iterator cVar6;
  byte *pbVar7;
  type *in1;
  long in_RSI;
  TaprootSpendData *in_RDI;
  long in_FS_OFFSET;
  type *leaf_origin;
  type *pubkey;
  map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  *__range1_1;
  type *script;
  type *leaf_ver;
  type *depth;
  vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *__range2;
  pair<const_CPubKey,_KeyOriginInfo> *key_pair;
  map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
  *__range1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1;
  const_iterator __begin1;
  TaprootSpendData spenddata;
  TaprootBuilder builder;
  TaprootSpendData *in_stack_fffffffffffffd68;
  map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  *in_stack_fffffffffffffd70;
  TaprootBuilder *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  uint in_stack_fffffffffffffd84;
  TaprootBuilder *in_stack_fffffffffffffd88;
  TaprootSpendData *in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  TaprootBuilder *in_stack_fffffffffffffdc0;
  uchar *in_stack_fffffffffffffe28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffd68);
  if (!bVar5) {
    CScript::operator=((CScript *)in_stack_fffffffffffffd78,(CScript *)in_stack_fffffffffffffd70);
  }
  bVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffd68);
  if (!bVar5) {
    CScript::operator=((CScript *)in_stack_fffffffffffffd78,(CScript *)in_stack_fffffffffffffd70);
  }
  std::
  map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
  ::begin((map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
           *)in_stack_fffffffffffffd70);
  std::
  map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
  ::end((map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
         *)in_stack_fffffffffffffd70);
  while (bVar5 = std::operator==((_Self *)in_stack_fffffffffffffd78,
                                 (_Self *)in_stack_fffffffffffffd70), ((bVar5 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_const_iterator<std::pair<const_CPubKey,_KeyOriginInfo>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_CPubKey,_KeyOriginInfo>_> *)
               in_stack_fffffffffffffd68);
    in_stack_fffffffffffffd88 = (TaprootBuilder *)(in_RSI + 400);
    CPubKey::GetID((CPubKey *)in_RDI);
    std::
    map<CKeyID,std::pair<CPubKey,KeyOriginInfo>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
    ::emplace<CKeyID,std::pair<CPubKey_const,KeyOriginInfo>const&>
              ((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                *)in_stack_fffffffffffffd88,
               (CKeyID *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (pair<const_CPubKey,_KeyOriginInfo> *)in_stack_fffffffffffffd78);
    std::_Rb_tree_const_iterator<std::pair<const_CPubKey,_KeyOriginInfo>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_CPubKey,_KeyOriginInfo>_> *)
               in_stack_fffffffffffffd68);
  }
  bVar5 = std::
          vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::empty((vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)in_stack_fffffffffffffd78);
  if ((!bVar5) &&
     (bVar5 = XOnlyPubKey::IsFullyValid((XOnlyPubKey *)in_stack_fffffffffffffd78), bVar5)) {
    TaprootBuilder::TaprootBuilder(in_stack_fffffffffffffd88);
    this_00 = std::
              vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::begin((vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)in_stack_fffffffffffffd70);
    cVar6 = std::
            vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::end((vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)in_stack_fffffffffffffd70);
    while (bVar5 = __gnu_cxx::
                   operator==<const_std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                             ((__normal_iterator<const_std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                               *)in_stack_fffffffffffffd78,
                              (__normal_iterator<const_std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                               *)in_stack_fffffffffffffd70), ((bVar5 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ::operator*((__normal_iterator<const_std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   *)in_stack_fffffffffffffd68);
      pbVar7 = std::
               get<0ul,unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ((tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)in_stack_fffffffffffffd68);
      std::
      get<1ul,unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffd68);
      std::
      get<2ul,unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffd68);
      in_stack_fffffffffffffd84 = (uint)*pbVar7;
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffffd78,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd68);
      script_00.m_size = (size_t)cVar6._M_current;
      script_00.m_data = in_stack_fffffffffffffe28;
      TaprootBuilder::Add(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,script_00,
                          in_stack_fffffffffffffdb8,
                          SUB81((ulong)in_stack_fffffffffffffdb0 >> 0x38,0));
      __gnu_cxx::
      __normal_iterator<const_std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ::operator++((__normal_iterator<const_std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                    *)in_stack_fffffffffffffd68);
    }
    bVar5 = TaprootBuilder::IsComplete(in_stack_fffffffffffffd78);
    in_stack_fffffffffffffd80 = CONCAT13(bVar5,(int3)in_stack_fffffffffffffd80);
    if (!bVar5) {
      __assert_fail("builder.IsComplete()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/psbt.cpp"
                    ,0xf1,"void PSBTOutput::FillSignatureData(SignatureData &) const");
    }
    TaprootBuilder::Finalize((TaprootBuilder *)in_RDI,(XOnlyPubKey *)in_stack_fffffffffffffd88);
    TaprootBuilder::GetSpendData((TaprootBuilder *)this_00._M_current);
    poVar2 = *(pointer *)in_RDI[1].internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems;
    poVar3 = *(pointer *)
              ((long)in_RDI[1].internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 8);
    uVar4 = *(undefined8 *)
             ((long)in_RDI[1].internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18);
    *(pointer *)(in_RSI + 0x90) =
         *(pointer *)
          ((long)in_RDI[1].internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10);
    *(undefined8 *)(in_RSI + 0x98) = uVar4;
    *(pointer *)(in_RSI + 0x80) = poVar2;
    *(pointer *)(in_RSI + 0x88) = poVar3;
    in_stack_fffffffffffffd78 = (TaprootBuilder *)(in_RSI + 0x80);
    TaprootSpendData::TaprootSpendData(in_stack_fffffffffffffd68,(TaprootSpendData *)0x68c207);
    TaprootSpendData::Merge(in_stack_fffffffffffffd98,in_RDI);
    TaprootSpendData::~TaprootSpendData(in_stack_fffffffffffffd68);
    TaprootSpendData::~TaprootSpendData(in_stack_fffffffffffffd68);
    TaprootBuilder::~TaprootBuilder((TaprootBuilder *)in_stack_fffffffffffffd68);
  }
  std::
  map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  ::begin(in_stack_fffffffffffffd70);
  std::
  map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  ::end(in_stack_fffffffffffffd70);
  while (bVar5 = std::operator==((_Self *)in_stack_fffffffffffffd78,
                                 (_Self *)in_stack_fffffffffffffd70), ((bVar5 ^ 0xffU) & 1) != 0) {
    std::
    _Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
                 *)in_stack_fffffffffffffd68);
    std::
    get<0ul,XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
              ((pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>
                *)in_stack_fffffffffffffd68);
    in1 = std::
          get<1ul,XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
                    ((pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>
                      *)in_stack_fffffffffffffd68);
    std::
    map<XOnlyPubKey,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
    ::
    emplace<XOnlyPubKey_const&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>const&>
              ((map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
                *)in_stack_fffffffffffffd88,
               (XOnlyPubKey *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                *)in_stack_fffffffffffffd78);
    in_stack_fffffffffffffd70 =
         (map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
          *)(in_RSI + 0x238);
    Hash160<XOnlyPubKey>((XOnlyPubKey *)in1);
    std::
    map<CKeyID,XOnlyPubKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,XOnlyPubKey>>>::
    emplace<uint160,XOnlyPubKey_const&>
              ((map<CKeyID,_XOnlyPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_XOnlyPubKey>_>_>
                *)in_stack_fffffffffffffd88,
               (uint160 *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (XOnlyPubKey *)in_stack_fffffffffffffd78);
    std::
    _Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
                  *)in_stack_fffffffffffffd68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PSBTOutput::FillSignatureData(SignatureData& sigdata) const
{
    if (!redeem_script.empty()) {
        sigdata.redeem_script = redeem_script;
    }
    if (!witness_script.empty()) {
        sigdata.witness_script = witness_script;
    }
    for (const auto& key_pair : hd_keypaths) {
        sigdata.misc_pubkeys.emplace(key_pair.first.GetID(), key_pair);
    }
    if (!m_tap_tree.empty() && m_tap_internal_key.IsFullyValid()) {
        TaprootBuilder builder;
        for (const auto& [depth, leaf_ver, script] : m_tap_tree) {
            builder.Add((int)depth, script, (int)leaf_ver, /*track=*/true);
        }
        assert(builder.IsComplete());
        builder.Finalize(m_tap_internal_key);
        TaprootSpendData spenddata = builder.GetSpendData();

        sigdata.tr_spenddata.internal_key = m_tap_internal_key;
        sigdata.tr_spenddata.Merge(spenddata);
    }
    for (const auto& [pubkey, leaf_origin] : m_tap_bip32_paths) {
        sigdata.taproot_misc_pubkeys.emplace(pubkey, leaf_origin);
        sigdata.tap_pubkeys.emplace(Hash160(pubkey), pubkey);
    }
}